

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O2

SchemeObject * OpenOutputPortProcedure(SchemeObject *arguments)

{
  SchemeObject *pSVar1;
  FILE *pFVar2;
  
  pSVar1 = Car(arguments);
  pSVar1 = (pSVar1->data).pair.car;
  pFVar2 = fopen((char *)pSVar1,"w");
  if (pFVar2 != (FILE *)0x0) {
    pSVar1 = AllocObject();
    pSVar1->type = OUT_PORT;
    (pSVar1->data).pair.car = (SchemeObject *)pFVar2;
    return pSVar1;
  }
  fprintf(_stderr,"could not open file: \"%s\".\n",pSVar1);
  exit(1);
}

Assistant:

extern SchemeObject*
OpenOutputPortProcedure(SchemeObject* arguments)
{
    char* filename = Car(arguments)->data.string.value;
    FILE* out = fopen(filename, "w");

    if (out == NULL) {
        fprintf(stderr, "could not open file: \"%s\".\n", filename);
        exit(1);
    }
    return MakeOutputPort(out);
}